

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.h
# Opt level: O0

bool __thiscall
cmArgumentParser<void>::Bind<std::__cxx11::string>
          (cmArgumentParser<void> *this,string_view name,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ref)

{
  string_view name_00;
  bool bVar1;
  anon_class_8_1_ba1d73f3 local_60;
  KeywordAction local_58;
  cmArgumentParser<void> *local_38;
  char *pcStack_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ref_local;
  cmArgumentParser<void> *this_local;
  string_view name_local;
  
  pcStack_30 = name._M_str;
  local_38 = (cmArgumentParser<void> *)name._M_len;
  local_60.ref = ref;
  local_28 = ref;
  ref_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  this_local = local_38;
  name_local._M_len = (size_t)pcStack_30;
  std::function<void(ArgumentParser::Instance&)>::
  function<cmArgumentParser<void>::Bind<std::__cxx11::string>(std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&)::_lambda(ArgumentParser::Instance&)_1_,void>
            ((function<void(ArgumentParser::Instance&)> *)&local_58,&local_60);
  name_00._M_str = pcStack_30;
  name_00._M_len = (size_t)local_38;
  bVar1 = ArgumentParser::Base::MaybeBind(&this->super_Base,name_00,&local_58);
  std::function<void_(ArgumentParser::Instance_&)>::~function(&local_58);
  return bVar1;
}

Assistant:

bool Bind(cm::string_view name, T& ref)
  {
    return this->MaybeBind(name,
                           [&ref](Instance& instance) { instance.Bind(ref); });
  }